

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall slang::parsing::Parser::parseModportPort(Parser *this)

{
  Token name_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token name_01;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements_01;
  Token direction_00;
  Token clocking_00;
  Token name_02;
  Token dot_00;
  Token openParen_00;
  Token closeParen;
  bool bVar1;
  bool bVar2;
  EVP_PKEY_CTX *src;
  undefined8 *in_RDI;
  Token TVar3;
  Token TVar4;
  Token TVar5;
  Token TVar6;
  Token name_1;
  ExpressionSyntax *expr;
  Token openParen;
  Token name;
  Token dot;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token clocking;
  Token direction;
  AttrList attributes;
  ParserBase *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined2 in_stack_fffffffffffffb24;
  TokenKind in_stack_fffffffffffffb26;
  undefined6 in_stack_fffffffffffffb28;
  TokenKind in_stack_fffffffffffffb2e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  ParserBase *in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  Info *in_stack_fffffffffffffb50;
  Info *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  Info *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  SourceLocation in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  DiagCode code;
  Info *in_stack_fffffffffffffba8;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffbb0;
  TokenKind local_2f8;
  TokenKind local_2e8;
  Parser *in_stack_fffffffffffffd50;
  Token local_2a8;
  Token local_298;
  Token local_288;
  Token local_278;
  Token local_268;
  ExpressionSyntax *local_240;
  Token local_238;
  Token local_228;
  Token local_218;
  Parser *in_stack_fffffffffffffe30;
  AttrList in_stack_fffffffffffffe38;
  Token local_120;
  SourceLocation local_110;
  Token local_108;
  Token local_f8;
  SourceLocation local_e8;
  undefined4 local_dc;
  Token local_d8;
  pointer local_c8;
  size_t local_c0;
  Token local_b8;
  undefined8 local_a8;
  Info *local_a0;
  pointer local_98;
  size_t local_90;
  Token local_50;
  Token local_40;
  undefined8 local_30;
  Info *pIStack_28;
  AttrList local_20;
  ModportSimplePortListSyntax *local_8;
  
  code = SUB84((ulong)in_stack_fffffffffffffb90 >> 0x20,0);
  local_20 = parseAttributes(in_stack_fffffffffffffd50);
  Token::Token((Token *)CONCAT26(in_stack_fffffffffffffb26,
                                 CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)));
  local_40 = ParserBase::peek(in_stack_fffffffffffffb18);
  if (local_40.kind == ClockingKeyword) {
    local_50 = ParserBase::consume(in_stack_fffffffffffffb40);
    kind = (TokenKind)((ulong)in_stack_fffffffffffffba8 >> 0x30);
    local_98 = local_20._M_ptr;
    local_90 = local_20._M_extent._M_extent_value;
    elements._M_ptr._6_2_ = in_stack_fffffffffffffb2e;
    elements._M_ptr._0_6_ = in_stack_fffffffffffffb28;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffb30._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT26(in_stack_fffffffffffffb26,
                        CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),elements);
    TVar3 = local_50;
    local_a8._0_2_ = local_50.kind;
    local_a8._2_1_ = local_50._2_1_;
    local_a8._3_1_ = local_50.numFlags.raw;
    local_a8._4_4_ = local_50.rawLen;
    local_50.info = TVar3.info;
    local_a0 = local_50.info;
    local_50 = TVar3;
    local_b8 = ParserBase::expect(in_stack_fffffffffffffbb0,kind);
    clocking_00.info = (Info *)in_stack_fffffffffffffb40;
    clocking_00.kind = (short)in_stack_fffffffffffffb38;
    clocking_00._2_1_ = (char)((ulong)in_stack_fffffffffffffb38 >> 0x10);
    clocking_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb38 >> 0x18);
    clocking_00.rawLen = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
    name_01.rawLen._2_2_ = in_stack_fffffffffffffb2e;
    name_01._0_6_ = in_stack_fffffffffffffb28;
    name_01.info = (Info *)in_stack_fffffffffffffb30._M_extent_value;
    local_8 = (ModportSimplePortListSyntax *)
              slang::syntax::SyntaxFactory::modportClockingPort
                        ((SyntaxFactory *)
                         CONCAT26(in_stack_fffffffffffffb26,
                                  CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         in_stack_fffffffffffffb18,clocking_00,name_01);
  }
  else {
    if ((local_40.kind != ExportKeyword) && (local_40.kind != ImportKeyword)) {
      if (((ushort)(local_40.kind - InOutKeyword) < 2) ||
         ((local_40.kind == OutputKeyword || (local_40.kind == RefKeyword)))) {
        TVar3 = ParserBase::consume(in_stack_fffffffffffffb40);
        local_d8._0_8_ = TVar3._0_8_;
        local_30._0_2_ = local_d8.kind;
        local_30._2_1_ = local_d8._2_1_;
        local_30._3_1_ = local_d8.numFlags.raw;
        local_30._4_4_ = local_d8.rawLen;
        local_d8.info = TVar3.info;
        pIStack_28 = local_d8.info;
        local_d8 = TVar3;
      }
      else {
        local_dc = 0x7e0005;
        local_f8 = ParserBase::peek(in_stack_fffffffffffffb18);
        local_e8 = Token::location(&local_f8);
        ParserBase::addDiag((ParserBase *)
                            CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),code,
                            in_stack_fffffffffffffb88);
        local_120 = ParserBase::peek(in_stack_fffffffffffffb18);
        local_110 = Token::location(&local_120);
        TVar3 = ParserBase::missingToken
                          ((ParserBase *)
                           CONCAT26(in_stack_fffffffffffffb2e,in_stack_fffffffffffffb28),
                           in_stack_fffffffffffffb26,
                           (SourceLocation)in_stack_fffffffffffffb30._M_extent_value);
        local_108._0_8_ = TVar3._0_8_;
        local_30._0_2_ = local_108.kind;
        local_30._2_1_ = local_108._2_1_;
        local_30._3_1_ = local_108.numFlags.raw;
        local_30._4_4_ = local_108.rawLen;
        local_108.info = TVar3.info;
        pIStack_28 = local_108.info;
        local_108 = TVar3;
      }
      SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
                ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0xa403b0);
      TVar5.info = in_stack_fffffffffffffba8;
      TVar5._0_8_ = in_stack_fffffffffffffbb0;
      TVar3.info = in_stack_fffffffffffffb70;
      TVar3.kind = (short)in_stack_fffffffffffffb78;
      TVar3._2_1_ = (char)((ulong)in_stack_fffffffffffffb78 >> 0x10);
      TVar3.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb78 >> 0x18);
      TVar3.rawLen = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
      TVar6.info = in_stack_fffffffffffffb60;
      TVar6.kind = (short)in_stack_fffffffffffffb68;
      TVar6._2_1_ = (char)((ulong)in_stack_fffffffffffffb68 >> 0x10);
      TVar6.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb68 >> 0x18);
      TVar6.rawLen = (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
      do {
        bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffb30._M_extent_value,
                                 in_stack_fffffffffffffb2e);
        if (bVar1) {
          TVar4 = ParserBase::consume(in_stack_fffffffffffffb40);
          local_218 = TVar4;
          TVar4 = ParserBase::expect(TVar5._0_8_,TVar5.info._6_2_);
          local_228 = TVar4;
          TVar4 = ParserBase::expect(TVar5._0_8_,TVar5.info._6_2_);
          local_240 = (ExpressionSyntax *)0x0;
          local_238 = TVar4;
          bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffb30._M_extent_value,
                                   in_stack_fffffffffffffb2e);
          if (!bVar1) {
            local_240 = parseExpression((Parser *)
                                        CONCAT26(in_stack_fffffffffffffb26,
                                                 CONCAT24(in_stack_fffffffffffffb24,
                                                          in_stack_fffffffffffffb20)));
          }
          local_288 = local_238;
          local_278 = local_228;
          local_268 = local_218;
          TVar4 = ParserBase::expect(TVar5._0_8_,TVar5.info._6_2_);
          in_stack_fffffffffffffb30._M_extent_value = (size_t)TVar4.info;
          in_stack_fffffffffffffb28 = TVar4._0_6_;
          in_stack_fffffffffffffb2e = TVar4.rawLen._2_2_;
          in_stack_fffffffffffffb20 = local_288.info._0_4_;
          in_stack_fffffffffffffb24 = local_288.info._4_2_;
          in_stack_fffffffffffffb26 = local_288.info._6_2_;
          dot_00.info = in_stack_fffffffffffffb50;
          dot_00.kind = (short)in_stack_fffffffffffffb48;
          dot_00._2_1_ = (char)((ulong)in_stack_fffffffffffffb48 >> 0x10);
          dot_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb48 >> 0x18);
          dot_00.rawLen = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
          name_02.info = (Info *)in_stack_fffffffffffffb40;
          name_02.kind = (short)in_stack_fffffffffffffb38;
          name_02._2_1_ = (char)((ulong)in_stack_fffffffffffffb38 >> 0x10);
          name_02.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb38 >> 0x18);
          name_02.rawLen = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
          openParen_00.info = TVar6._0_8_;
          openParen_00._0_8_ = TVar6.info;
          closeParen.info = TVar3._0_8_;
          closeParen._0_8_ = TVar3.info;
          in_stack_fffffffffffffb18 = (ParserBase *)local_288._0_8_;
          local_298 = TVar4;
          slang::syntax::SyntaxFactory::modportExplicitPort
                    ((SyntaxFactory *)in_stack_fffffffffffffb30._M_extent_value,dot_00,name_02,
                     openParen_00,TVar4._0_8_,closeParen);
          slang::syntax::TokenOrSyntax::TokenOrSyntax
                    ((TokenOrSyntax *)
                     CONCAT26(in_stack_fffffffffffffb26,
                              CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),
                     (SyntaxNode *)in_stack_fffffffffffffb18);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)
                     CONCAT26(in_stack_fffffffffffffb26,
                              CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),
                     (TokenOrSyntax *)in_stack_fffffffffffffb18);
        }
        else {
          TVar5 = ParserBase::expect(TVar5._0_8_,TVar5.info._6_2_);
          name_00.info._0_4_ = in_stack_fffffffffffffb20;
          name_00._0_8_ = in_stack_fffffffffffffb18;
          name_00.info._4_2_ = in_stack_fffffffffffffb24;
          name_00.info._6_2_ = in_stack_fffffffffffffb26;
          local_2a8 = TVar5;
          slang::syntax::SyntaxFactory::modportNamedPort((SyntaxFactory *)0xa406c0,name_00);
          slang::syntax::TokenOrSyntax::TokenOrSyntax
                    ((TokenOrSyntax *)
                     CONCAT26(in_stack_fffffffffffffb26,
                              CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),
                     (SyntaxNode *)in_stack_fffffffffffffb18);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)
                     CONCAT26(in_stack_fffffffffffffb26,
                              CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),
                     (TokenOrSyntax *)in_stack_fffffffffffffb18);
          bVar1 = Token::isMissing(&local_2a8);
          if (bVar1) {
LAB_00a40870:
            elements_00._M_ptr._6_2_ = in_stack_fffffffffffffb2e;
            elements_00._M_ptr._0_6_ = in_stack_fffffffffffffb28;
            elements_00._M_extent._M_extent_value = in_stack_fffffffffffffb30._M_extent_value;
            slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                      ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                       CONCAT26(in_stack_fffffffffffffb26,
                                CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),
                       elements_00);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&stack0xfffffffffffffe08,
                       (EVP_PKEY_CTX *)*in_RDI,src);
            elements_01._M_ptr._6_2_ = in_stack_fffffffffffffb2e;
            elements_01._M_ptr._0_6_ = in_stack_fffffffffffffb28;
            elements_01._M_extent._M_extent_value = in_stack_fffffffffffffb30._M_extent_value;
            slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
            SeparatedSyntaxList((SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *)
                                CONCAT26(in_stack_fffffffffffffb26,
                                         CONCAT24(in_stack_fffffffffffffb24,
                                                  in_stack_fffffffffffffb20)),elements_01);
            direction_00.rawLen._2_2_ = in_stack_fffffffffffffb2e;
            direction_00._0_6_ = in_stack_fffffffffffffb28;
            direction_00.info = (Info *)in_stack_fffffffffffffb30._M_extent_value;
            local_8 = slang::syntax::SyntaxFactory::modportSimplePortList
                                ((SyntaxFactory *)
                                 CONCAT26(in_stack_fffffffffffffb26,
                                          CONCAT24(in_stack_fffffffffffffb24,
                                                   in_stack_fffffffffffffb20)),
                                 (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                 in_stack_fffffffffffffb18,direction_00,
                                 (SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *)0xa40949);
            SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
                      ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0xa4096a);
            return &local_8->super_MemberSyntax;
          }
        }
        bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffb30._M_extent_value,
                                 in_stack_fffffffffffffb2e);
        bVar1 = true;
        if (bVar2) {
          TVar6 = ParserBase::peek((ParserBase *)
                                   CONCAT26(in_stack_fffffffffffffb2e,in_stack_fffffffffffffb28),
                                   CONCAT22(in_stack_fffffffffffffb26,in_stack_fffffffffffffb24));
          local_2e8 = TVar6.kind;
          bVar1 = false;
          if (local_2e8 != Dot) {
            TVar3 = ParserBase::peek((ParserBase *)
                                     CONCAT26(in_stack_fffffffffffffb2e,in_stack_fffffffffffffb28),
                                     CONCAT22(in_stack_fffffffffffffb26,in_stack_fffffffffffffb24));
            local_2f8 = TVar3.kind;
            bVar1 = local_2f8 != Identifier;
          }
        }
        if (bVar1) goto LAB_00a40870;
        TVar6 = ParserBase::consume(in_stack_fffffffffffffb40);
        TVar4.rawLen._2_2_ = in_stack_fffffffffffffb2e;
        TVar4._0_6_ = in_stack_fffffffffffffb28;
        TVar4.info = (Info *)in_stack_fffffffffffffb30._M_extent_value;
        slang::syntax::TokenOrSyntax::TokenOrSyntax
                  ((TokenOrSyntax *)
                   CONCAT26(in_stack_fffffffffffffb26,
                            CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),TVar4);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)
                   CONCAT26(in_stack_fffffffffffffb26,
                            CONCAT24(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),
                   (TokenOrSyntax *)in_stack_fffffffffffffb18);
      } while( true );
    }
    local_c8 = local_20._M_ptr;
    local_c0 = local_20._M_extent._M_extent_value;
    local_8 = (ModportSimplePortListSyntax *)
              parseModportSubroutinePortList(in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
  }
  return &((ModportClockingPortSyntax *)local_8)->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseModportPort() {
    auto attributes = parseAttributes();

    Token direction;
    switch (peek().kind) {
        case TokenKind::ClockingKeyword: {
            auto clocking = consume();
            return factory.modportClockingPort(attributes, clocking, expect(TokenKind::Identifier));
        }
        case TokenKind::ImportKeyword:
        case TokenKind::ExportKeyword:
            return parseModportSubroutinePortList(attributes);
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
            direction = consume();
            break;
        default:
            addDiag(diag::MissingModportPortDirection, peek().location());
            direction = missingToken(TokenKind::InputKeyword, peek().location());
            break;
    }

    SmallVector<TokenOrSyntax, 8> buffer;
    while (true) {
        if (peek(TokenKind::Dot)) {
            auto dot = consume();
            auto name = expect(TokenKind::Identifier);
            auto openParen = expect(TokenKind::OpenParenthesis);

            ExpressionSyntax* expr = nullptr;
            if (!peek(TokenKind::CloseParenthesis))
                expr = &parseExpression();

            buffer.push_back(&factory.modportExplicitPort(dot, name, openParen, expr,
                                                          expect(TokenKind::CloseParenthesis)));
        }
        else {
            auto name = expect(TokenKind::Identifier);
            buffer.push_back(&factory.modportNamedPort(name));
            if (name.isMissing())
                break;
        }

        if (!peek(TokenKind::Comma) ||
            (peek(1).kind != TokenKind::Dot && peek(1).kind != TokenKind::Identifier)) {
            break;
        }

        buffer.push_back(consume());
    }

    return factory.modportSimplePortList(attributes, direction, buffer.copy(alloc));
}